

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::UnicodeString::setTo
          (UnicodeString *this,UBool isTerminated,ConstChar16Ptr *textPtr,int32_t textLength)

{
  char16_t *pcVar1;
  UChar *s;
  ushort uVar2;
  
  uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar2 & 0x10) == 0) {
    s = textPtr->p_;
    if (s == (UChar *)0x0) {
      if ((uVar2 & 4) != 0) {
        LOCK();
        pcVar1 = (this->fUnion).fFields.fArray + -2;
        *(int *)pcVar1 = *(int *)pcVar1 + -1;
        UNLOCK();
        if (*(int *)pcVar1 == 0) {
          uprv_free_63((this->fUnion).fFields.fArray + -2);
        }
      }
      (this->fUnion).fStackFields.fLengthAndFlags = 2;
    }
    else if (((textLength < -1) || (isTerminated == '\0' && textLength == -1)) ||
            ((textLength != -1 && isTerminated != '\0' && (s[(uint)textLength] != L'\0')))) {
      setToBogus(this);
    }
    else {
      if ((uVar2 & 4) != 0) {
        LOCK();
        pcVar1 = (this->fUnion).fFields.fArray + -2;
        *(int *)pcVar1 = *(int *)pcVar1 + -1;
        UNLOCK();
        if (*(int *)pcVar1 == 0) {
          uprv_free_63((this->fUnion).fFields.fArray + -2);
        }
      }
      if (textLength == -1) {
        textLength = u_strlen_63(s);
      }
      if (textLength < 0x400) {
        uVar2 = (ushort)(textLength << 5) | 8;
      }
      else {
        (this->fUnion).fFields.fLength = textLength;
        uVar2 = 0xffe8;
      }
      (this->fUnion).fStackFields.fLengthAndFlags = uVar2;
      (this->fUnion).fFields.fArray = s;
      (this->fUnion).fFields.fCapacity = (textLength + 1) - (uint)(isTerminated == '\0');
    }
  }
  return this;
}

Assistant:

UnicodeString &
UnicodeString::setTo(UBool isTerminated,
                     ConstChar16Ptr textPtr,
                     int32_t textLength)
{
  if(fUnion.fFields.fLengthAndFlags & kOpenGetBuffer) {
    // do not modify a string that has an "open" getBuffer(minCapacity)
    return *this;
  }

  const UChar *text = textPtr;
  if(text == NULL) {
    // treat as an empty string, do not alias
    releaseArray();
    setToEmpty();
    return *this;
  }

  if( textLength < -1 ||
      (textLength == -1 && !isTerminated) ||
      (textLength >= 0 && isTerminated && text[textLength] != 0)
  ) {
    setToBogus();
    return *this;
  }

  releaseArray();

  if(textLength == -1) {
    // text is terminated, or else it would have failed the above test
    textLength = u_strlen(text);
  }
  fUnion.fFields.fLengthAndFlags = kReadonlyAlias;
  setArray((UChar *)text, textLength, isTerminated ? textLength + 1 : textLength);
  return *this;
}